

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

int AF_AActor_TeleportMove
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double thing;
  int iVar1;
  VMValue *pVVar2;
  bool bVar3;
  bool local_7b;
  TVector3<double> local_78;
  uint local_60;
  bool local_5a;
  byte local_59;
  int u;
  bool modify;
  bool telefrag;
  double z;
  double y;
  double x;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1c8,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1c8,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  x = (param->field_0).f;
  local_7b = true;
  if ((DObject *)x != (DObject *)0x0) {
    local_7b = DObject::IsKindOf((DObject *)x,AActor::RegistrationInfo.MyClass);
  }
  if (local_7b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1c8,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  iVar1 = (int)self + 1;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1c9,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1c9,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  y = (double)defaultparam_local[iVar1].Array;
  iVar1 = (int)self + 2;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1ca,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1ca,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  z = (double)defaultparam_local[iVar1].Array;
  iVar1 = (int)self + 3;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1cb,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((char)defaultparam_local[iVar1].Count != '\x01') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1cb,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  _u = defaultparam_local[iVar1].Array;
  iVar1 = (int)self + 4;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1cc,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((char)defaultparam_local[iVar1].Count != '\0') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1cc,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  local_59 = *(int *)&defaultparam_local[iVar1].Array != 0;
  self._0_4_ = (int)self + 5;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x1cd,
                    "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar1 = *(int *)&defaultparam_local[(int)self].Array;
  }
  else {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x1cd,
                    "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    iVar1 = (pVVar2->field_0).i;
  }
  thing = x;
  local_5a = iVar1 != 0;
  TVector3<double>::TVector3(&local_78,y,z,(double)_u);
  bVar3 = P_TeleportMove((AActor *)thing,&local_78,(bool)(local_59 & 1),(bool)(local_5a & 1));
  local_60 = (uint)bVar3;
  if (self._4_4_ < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (_paramnum == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x1ce,
                    "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    VMReturn::SetInt(_paramnum,local_60);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TeleportMove)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL(telefrag);
	PARAM_BOOL_DEF(modify);
	ACTION_RETURN_BOOL(P_TeleportMove(self, DVector3(x, y, z), telefrag, modify));
}